

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O3

char * __thiscall MeCab::ChunkFreeList<char>::alloc(ChunkFreeList<char> *this,size_t req)

{
  iterator __position;
  pointer ppVar1;
  char *pcVar2;
  size_t sVar3;
  pointer ppVar4;
  ulong uVar5;
  ulong uVar6;
  char **ppcVar7;
  pair<unsigned_long,_char_*> local_30;
  
  ppVar4 = (this->freelist_).
           super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->freelist_).
       super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)__position._M_current - (long)ppVar4 >> 4;
  uVar6 = this->li_;
  if (uVar6 < uVar5) {
    sVar3 = this->pi_;
    ppcVar7 = &ppVar4[uVar6].second;
    do {
      uVar6 = uVar6 + 1;
      if (sVar3 + req < ((pair<unsigned_long,_char_*> *)(ppcVar7 + -1))->first) {
        pcVar2 = *ppcVar7;
        this->pi_ = sVar3 + req;
        return pcVar2 + sVar3;
      }
      this->li_ = uVar6;
      this->pi_ = 0;
      ppcVar7 = ppcVar7 + 2;
      sVar3 = 0;
    } while (uVar6 != uVar5);
  }
  uVar6 = this->default_size;
  if (this->default_size <= req) {
    uVar6 = req;
  }
  local_30.second = (char *)operator_new__(uVar6);
  if (__position._M_current ==
      (this->freelist_).
      super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_30.first = uVar6;
    std::vector<std::pair<unsigned_long,char*>,std::allocator<std::pair<unsigned_long,char*>>>::
    _M_realloc_insert<std::pair<unsigned_long,char*>>
              ((vector<std::pair<unsigned_long,char*>,std::allocator<std::pair<unsigned_long,char*>>>
                *)&this->freelist_,__position,&local_30);
    ppVar4 = (this->freelist_).
             super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (__position._M_current)->first = uVar6;
    (__position._M_current)->second = local_30.second;
    ppVar4 = (this->freelist_).
             super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->freelist_).
    super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
  }
  ppVar1 = (this->freelist_).
           super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar3 = ((long)ppVar4 - (long)ppVar1 >> 4) - 1;
  this->li_ = sVar3;
  this->pi_ = this->pi_ + req;
  return ppVar1[sVar3].second;
}

Assistant:

T* alloc(size_t req = 1) {
    while (li_ < freelist_.size()) {
      if ((pi_ + req) < freelist_[li_].first) {
        T *r = freelist_[li_].second + pi_;
        pi_ += req;
        return r;
      }
      li_++;
      pi_ = 0;
    }
    size_t _size = std::max(req, default_size);
    freelist_.push_back(std::make_pair(_size, new T[_size]));
    li_ = freelist_.size() - 1;
    pi_ += req;
    return freelist_[li_].second;
  }